

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int StartThreadPololux(POLOLU *pPololu)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *pCriticalSection;
  THREAD_IDENTIFIER *pThreadId;
  
  pCriticalSection = PololuCS;
  pThreadId = PololuThreadId;
  lVar2 = 0;
  do {
    if (*(POLOLU **)((long)addrsPololu + lVar2 * 2) == pPololu) {
      *(undefined4 *)((long)resPololu + lVar2) = 1;
      *(undefined4 *)((long)bExitPololu + lVar2) = 0;
      InitCriticalSection(pCriticalSection);
      iVar1 = CreateDefaultThread(PololuThread,pPololu,pThreadId);
      return iVar1;
    }
    lVar2 = lVar2 + 4;
    pCriticalSection = pCriticalSection + 1;
    pThreadId = pThreadId + 1;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadPololux(POLOLU* pPololu)
{
	int id = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resPololu[id] = EXIT_FAILURE;
	bExitPololu[id] = FALSE;
	InitCriticalSection(&PololuCS[id]);
	return CreateDefaultThread(PololuThread, (void*)pPololu, &PololuThreadId[id]);
}